

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spfgmr.c
# Opt level: O3

SUNErrCode SUNLinSolInitialize_SPFGMR(SUNLinearSolver S)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  void *pvVar4;
  ulong uVar5;
  
  piVar2 = (int *)S->content;
  if (piVar2[3] < 0) {
    piVar2[3] = 0;
  }
  if (2 < piVar2[1] - 1U) {
    piVar2[1] = 0;
  }
  if (*(long *)(piVar2 + 0x18) == 0) {
    uVar3 = N_VCloneVectorArray(*piVar2 + 1,*(undefined8 *)(piVar2 + 0x24));
    *(undefined8 *)(piVar2 + 0x18) = uVar3;
  }
  if (*(long *)(piVar2 + 0x1a) == 0) {
    uVar3 = N_VCloneVectorArray(*piVar2 + 1,*(undefined8 *)(piVar2 + 0x24));
    *(undefined8 *)(piVar2 + 0x1a) = uVar3;
  }
  if (*(long *)(piVar2 + 0x1c) == 0) {
    iVar1 = *piVar2;
    pvVar4 = malloc((long)(int)(iVar1 + 1U) << 3);
    *(void **)(piVar2 + 0x1c) = pvVar4;
    if (-1 < (long)iVar1) {
      uVar5 = 0;
      do {
        *(undefined8 *)(*(long *)(piVar2 + 0x1c) + uVar5 * 8) = 0;
        pvVar4 = malloc((long)iVar1 << 3);
        *(void **)(*(long *)(piVar2 + 0x1c) + uVar5 * 8) = pvVar4;
        uVar5 = uVar5 + 1;
      } while (iVar1 + 1U != uVar5);
    }
  }
  if (*(long *)(piVar2 + 0x1e) == 0) {
    pvVar4 = malloc((long)*piVar2 << 4);
    *(void **)(piVar2 + 0x1e) = pvVar4;
  }
  if (*(long *)(piVar2 + 0x22) == 0) {
    pvVar4 = malloc((long)*piVar2 * 8 + 8);
    *(void **)(piVar2 + 0x22) = pvVar4;
  }
  if (*(long *)(piVar2 + 0x26) == 0) {
    pvVar4 = malloc((long)*piVar2 * 8 + 8);
    *(void **)(piVar2 + 0x26) = pvVar4;
  }
  if (*(long *)(piVar2 + 0x28) == 0) {
    pvVar4 = malloc((long)*piVar2 * 8 + 8);
    *(void **)(piVar2 + 0x28) = pvVar4;
  }
  return 0;
}

Assistant:

SUNErrCode SUNLinSolInitialize_SPFGMR(SUNLinearSolver S)
{
  SUNFunctionBegin(S->sunctx);
  int k;
  SUNLinearSolverContent_SPFGMR content;

  /* set shortcut to SPFGMR memory structure */
  content = SPFGMR_CONTENT(S);

  /* ensure valid options */
  if (content->max_restarts < 0)
  {
    content->max_restarts = SUNSPFGMR_MAXRS_DEFAULT;
  }

  SUNAssert(content->ATimes, SUN_ERR_ARG_CORRUPT);

  if ((content->pretype != SUN_PREC_LEFT) &&
      (content->pretype != SUN_PREC_RIGHT) && (content->pretype != SUN_PREC_BOTH))
  {
    content->pretype = SUN_PREC_NONE;
  }

  SUNAssert((content->pretype == SUN_PREC_NONE) || (content->Psolve != NULL),
            SUN_ERR_ARG_CORRUPT);

  /* allocate solver-specific memory (where the size depends on the
     choice of maxl) here */

  /*   Krylov subspace vectors */
  if (content->V == NULL)
  {
    content->V = N_VCloneVectorArray(content->maxl + 1, content->vtemp);
    SUNCheckLastErr();
  }

  /*   Preconditioned basis vectors */
  if (content->Z == NULL)
  {
    content->Z = N_VCloneVectorArray(content->maxl + 1, content->vtemp);
    SUNCheckLastErr();
  }

  /*   Hessenberg matrix Hes */
  if (content->Hes == NULL)
  {
    content->Hes =
      (sunrealtype**)malloc((content->maxl + 1) * sizeof(sunrealtype*));
    SUNAssert(content->Hes, SUN_ERR_MALLOC_FAIL);

    for (k = 0; k <= content->maxl; k++)
    {
      content->Hes[k] = NULL;
      content->Hes[k] = (sunrealtype*)malloc(content->maxl * sizeof(sunrealtype));
      SUNAssert(content->Hes[k], SUN_ERR_MALLOC_FAIL);
    }
  }

  /*   Givens rotation components */
  if (content->givens == NULL)
  {
    content->givens =
      (sunrealtype*)malloc(2 * content->maxl * sizeof(sunrealtype));
    SUNAssert(content->givens, SUN_ERR_MALLOC_FAIL);
  }

  /*    y and g vectors */
  if (content->yg == NULL)
  {
    content->yg = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->yg, SUN_ERR_MALLOC_FAIL);
  }

  /*    cv vector for fused vector ops */
  if (content->cv == NULL)
  {
    content->cv = (sunrealtype*)malloc((content->maxl + 1) * sizeof(sunrealtype));
    SUNAssert(content->cv, SUN_ERR_MALLOC_FAIL);
  }

  /*    Xv vector for fused vector ops */
  if (content->Xv == NULL)
  {
    content->Xv = (N_Vector*)malloc((content->maxl + 1) * sizeof(N_Vector));
    SUNAssert(content->Xv, SUN_ERR_MALLOC_FAIL);
  }

  /* return with success */
  return SUN_SUCCESS;
}